

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_reshuffle.c
# Opt level: O0

__m256i * dec_reshuffle(__m256i in)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  undefined8 in_YMM0_H;
  undefined8 in_register_00001218;
  undefined1 auVar8 [16];
  __m256i out;
  __m256i merge_ab_and_bc;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_110;
  undefined8 uStack_108;
  
  auVar1 = vpinsrd_avx(ZEXT416(0x1400140),0x1400140,1);
  auVar1 = vpinsrd_avx(auVar1,0x1400140,2);
  auVar1 = vpinsrd_avx(auVar1,0x1400140,3);
  auVar2 = vpinsrd_avx(ZEXT416(0x1400140),0x1400140,1);
  auVar2 = vpinsrd_avx(auVar2,0x1400140,2);
  auVar2 = vpinsrd_avx(auVar2,0x1400140,3);
  uStack_170 = auVar2._0_8_;
  uStack_168 = auVar2._8_8_;
  auVar6._8_8_ = in_XMM0_Qb;
  auVar6._0_8_ = in_XMM0_Qa;
  auVar6._16_8_ = in_YMM0_H;
  auVar6._24_8_ = in_register_00001218;
  auVar3._16_8_ = uStack_170;
  auVar3._0_16_ = auVar1;
  auVar3._24_8_ = uStack_168;
  auVar3 = vpmaddubsw_avx2(auVar6,auVar3);
  auVar1 = vpinsrd_avx(ZEXT416(0x11000),0x11000,1);
  auVar1 = vpinsrd_avx(auVar1,0x11000,2);
  auVar1 = vpinsrd_avx(auVar1,0x11000,3);
  auVar2 = vpinsrd_avx(ZEXT416(0x11000),0x11000,1);
  auVar2 = vpinsrd_avx(auVar2,0x11000,2);
  auVar2 = vpinsrd_avx(auVar2,0x11000,3);
  uStack_1d0 = auVar2._0_8_;
  uStack_1c8 = auVar2._8_8_;
  auVar7._16_8_ = uStack_1d0;
  auVar7._0_16_ = auVar1;
  auVar7._24_8_ = uStack_1c8;
  auVar3 = vpmaddwd_avx2(auVar3,auVar7);
  auVar1 = vpinsrb_avx(ZEXT116(2),1,1);
  auVar1 = vpinsrb_avx(auVar1,0,2);
  auVar1 = vpinsrb_avx(auVar1,6,3);
  auVar1 = vpinsrb_avx(auVar1,5,4);
  auVar1 = vpinsrb_avx(auVar1,4,5);
  auVar1 = vpinsrb_avx(auVar1,10,6);
  auVar1 = vpinsrb_avx(auVar1,9,7);
  auVar1 = vpinsrb_avx(auVar1,8,8);
  auVar1 = vpinsrb_avx(auVar1,0xe,9);
  auVar1 = vpinsrb_avx(auVar1,0xd,10);
  auVar1 = vpinsrb_avx(auVar1,0xc,0xb);
  auVar1 = vpinsrb_avx(auVar1,0xff,0xc);
  auVar1 = vpinsrb_avx(auVar1,0xff,0xd);
  auVar1 = vpinsrb_avx(auVar1,0xff,0xe);
  auVar1 = vpinsrb_avx(auVar1,0xff,0xf);
  auVar2 = vpinsrb_avx(ZEXT116(2),1,1);
  auVar2 = vpinsrb_avx(auVar2,0,2);
  auVar2 = vpinsrb_avx(auVar2,6,3);
  auVar2 = vpinsrb_avx(auVar2,5,4);
  auVar2 = vpinsrb_avx(auVar2,4,5);
  auVar2 = vpinsrb_avx(auVar2,10,6);
  auVar2 = vpinsrb_avx(auVar2,9,7);
  auVar2 = vpinsrb_avx(auVar2,8,8);
  auVar2 = vpinsrb_avx(auVar2,0xe,9);
  auVar2 = vpinsrb_avx(auVar2,0xd,10);
  auVar2 = vpinsrb_avx(auVar2,0xc,0xb);
  auVar2 = vpinsrb_avx(auVar2,0xff,0xc);
  auVar2 = vpinsrb_avx(auVar2,0xff,0xd);
  auVar2 = vpinsrb_avx(auVar2,0xff,0xe);
  auVar2 = vpinsrb_avx(auVar2,0xff,0xf);
  uStack_110 = auVar2._0_8_;
  uStack_108 = auVar2._8_8_;
  auVar5._16_8_ = uStack_110;
  auVar5._0_16_ = auVar1;
  auVar5._24_8_ = uStack_108;
  auVar3 = vpshufb_avx2(auVar3,auVar5);
  auVar1 = vpinsrd_avx(ZEXT416(5),6,1);
  auVar1 = vpinsrd_avx(auVar1,0xffffffff,2);
  auVar1 = vpinsrd_avx(auVar1,0xffffffff,3);
  auVar2 = vpinsrd_avx(ZEXT416(0),1,1);
  auVar2 = vpinsrd_avx(auVar2,2,2);
  auVar2 = vpinsrd_avx(auVar2,4,3);
  auVar8 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
  uStack_270 = auVar8._0_8_;
  uStack_268 = auVar8._8_8_;
  auVar4._16_8_ = uStack_270;
  auVar4._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar2;
  auVar4._24_8_ = uStack_268;
  vpermd_avx2(auVar4,auVar3);
  return (__m256i *)0x4;
}

Assistant:

static inline __m256i
dec_reshuffle (const __m256i in)
{
	// in, lower lane, bits, upper case are most significant bits, lower
	// case are least significant bits:
	// 00llllll 00kkkkLL 00jjKKKK 00JJJJJJ
	// 00iiiiii 00hhhhII 00ggHHHH 00GGGGGG
	// 00ffffff 00eeeeFF 00ddEEEE 00DDDDDD
	// 00cccccc 00bbbbCC 00aaBBBB 00AAAAAA

	const __m256i merge_ab_and_bc = _mm256_maddubs_epi16(in, _mm256_set1_epi32(0x01400140));
	// 0000kkkk LLllllll 0000JJJJ JJjjKKKK
	// 0000hhhh IIiiiiii 0000GGGG GGggHHHH
	// 0000eeee FFffffff 0000DDDD DDddEEEE
	// 0000bbbb CCcccccc 0000AAAA AAaaBBBB

	__m256i out = _mm256_madd_epi16(merge_ab_and_bc, _mm256_set1_epi32(0x00011000));
	// 00000000 JJJJJJjj KKKKkkkk LLllllll
	// 00000000 GGGGGGgg HHHHhhhh IIiiiiii
	// 00000000 DDDDDDdd EEEEeeee FFffffff
	// 00000000 AAAAAAaa BBBBbbbb CCcccccc

	// Pack bytes together in each lane:
	out = _mm256_shuffle_epi8(out, _mm256_setr_epi8(
		2, 1, 0, 6, 5, 4, 10, 9, 8, 14, 13, 12, -1, -1, -1, -1,
		2, 1, 0, 6, 5, 4, 10, 9, 8, 14, 13, 12, -1, -1, -1, -1));
	// 00000000 00000000 00000000 00000000
	// LLllllll KKKKkkkk JJJJJJjj IIiiiiii
	// HHHHhhhh GGGGGGgg FFffffff EEEEeeee
	// DDDDDDdd CCcccccc BBBBbbbb AAAAAAaa

	// Pack lanes:
	return _mm256_permutevar8x32_epi32(out, _mm256_setr_epi32(0, 1, 2, 4, 5, 6, -1, -1));
}